

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O1

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong *puVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  ulong *puVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong *puVar25;
  ulong uVar26;
  uint uVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong local_b8;
  ulong local_98;
  
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar4 = (ushort)*CTable_MatchLength;
  uVar11 = (ulong)mlCodeTable[nbSeq - 1];
  lVar7 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
  if (uVar4 == 0) {
    lVar7 = 1;
  }
  uVar15 = CTable_MatchLength[lVar7 + uVar11 * 2 + 2] + 0x8000;
  uVar5 = (ushort)*CTable_OffsetBits;
  lVar8 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
  if (uVar5 == 0) {
    lVar8 = 1;
  }
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar20 = (ulong)bVar1;
  uVar24 = CTable_OffsetBits[lVar8 + uVar20 * 2 + 2] + 0x8000;
  uVar6 = (ushort)*CTable_LitLength;
  lVar9 = (long)(1 << ((char)uVar6 - 1U & 0x1f));
  if (uVar6 == 0) {
    lVar9 = 1;
  }
  uVar22 = (ulong)llCodeTable[nbSeq - 1];
  uVar18 = CTable_LitLength[lVar9 + uVar22 * 2 + 2] + 0x8000;
  bVar2 = ""[uVar22];
  uVar21 = (uint)""[uVar11] + (uint)bVar2;
  if (0x3f < uVar21) goto LAB_001c3177;
  uVar10 = (ulong)*(ushort *)
                   ((long)CTable_MatchLength +
                   (long)(int)CTable_MatchLength[lVar7 + uVar11 * 2 + 1] * 2 +
                   (ulong)((uVar15 & 0xffff0000) - CTable_MatchLength[lVar7 + uVar11 * 2 + 2] >>
                          ((byte)(uVar15 >> 0x10) & 0x3f)) * 2 + 4);
  local_98 = (ulong)*(ushort *)
                     ((long)CTable_OffsetBits +
                     (long)(int)CTable_OffsetBits[lVar8 + uVar20 * 2 + 1] * 2 +
                     (ulong)((uVar24 & 0xffff0000) - CTable_OffsetBits[lVar8 + uVar20 * 2 + 2] >>
                            ((byte)(uVar24 >> 0x10) & 0x3f)) * 2 + 4);
  local_b8 = (ulong)*(ushort *)
                     ((long)CTable_LitLength +
                     (long)(int)CTable_LitLength[lVar9 + uVar22 * 2 + 1] * 2 +
                     (ulong)((uVar18 & 0xffff0000) - CTable_LitLength[lVar9 + uVar22 * 2 + 2] >>
                            ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
  uVar11 = (ulong)((uint)sequences[nbSeq - 1].mlBase & BIT_mask[""[uVar11]]) << (bVar2 & 0x3f) |
           (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[bVar2]);
  puVar25 = (ulong *)((long)dst + (dstCapacity - 8));
  puVar19 = (ulong *)dst;
  if (longOffsets == 0) {
    if (0x1f < bVar1) goto LAB_001c3196;
    uVar15 = uVar21 + bVar1;
    if (0x3f < uVar15) goto LAB_001c3177;
    uVar24 = sequences[nbSeq - 1].offBase;
  }
  else {
    uVar18 = 0x38;
    if (bVar1 < 0x38) {
      uVar18 = (uint)bVar1;
    }
    uVar15 = bVar1 - uVar18;
    if (0x38 < bVar1) {
      if (0x1f < uVar15) goto LAB_001c3196;
      uVar24 = uVar21 + uVar15;
      if (0x3f < uVar24) goto LAB_001c3177;
      if (puVar25 < dst) goto LAB_001c31b5;
      uVar11 = (ulong)(sequences[nbSeq - 1].offBase & BIT_mask[uVar15]) << ((byte)uVar21 & 0x3f) |
               uVar11;
      *(ulong *)dst = uVar11;
      puVar19 = (ulong *)((ulong)(uVar24 >> 3) + (long)dst);
      if (puVar25 < puVar19) {
        puVar19 = puVar25;
      }
      uVar21 = uVar24 & 7;
      uVar11 = uVar11 >> ((byte)uVar24 & 0x38);
    }
    uVar24 = sequences[nbSeq - 1].offBase >> ((byte)uVar15 & 0x1f);
    if (0x1f < bVar1) goto LAB_001c3196;
    uVar15 = uVar21 + uVar18;
    if (0x3f < uVar15) goto LAB_001c3177;
    uVar20 = (ulong)uVar18;
  }
  if (puVar25 < puVar19) {
LAB_001c31b5:
    __assert_fail("bitC->ptr <= bitC->endPtr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                  ,0xe1,"void BIT_flushBits(BIT_CStream_t *)");
  }
  uVar11 = (ulong)(uVar24 & BIT_mask[uVar20]) << ((byte)uVar21 & 0x3f) | uVar11;
  puVar12 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar19);
  if (puVar25 < puVar12) {
    puVar12 = puVar25;
  }
  *puVar19 = uVar11;
  uVar11 = uVar11 >> ((byte)uVar15 & 0x38);
  uVar15 = uVar15 & 7;
  if (1 < nbSeq) {
    uVar20 = nbSeq - 2;
    do {
      bVar1 = ofCodeTable[uVar20];
      uVar29 = (ulong)bVar1;
      uVar22 = CTable_OffsetBits[lVar8 + uVar29 * 2 + 2] + local_98;
      if (0x1fffff < uVar22) goto LAB_001c3196;
      uVar24 = uVar15 + (int)(uVar22 >> 0x10);
      if (0x3f < uVar24) goto LAB_001c3177;
      uVar18 = (uint)local_98;
      uVar13 = (ulong)mlCodeTable[uVar20];
      uVar17 = CTable_MatchLength[lVar7 + uVar13 * 2 + 2] + uVar10;
      if (0x1fffff < uVar17) goto LAB_001c3196;
      uVar21 = uVar24 + (int)(uVar17 >> 0x10);
      if (0x3f < uVar21) goto LAB_001c3177;
      uVar27 = (uint)uVar10;
      uVar26 = (ulong)llCodeTable[uVar20];
      uVar23 = CTable_LitLength[lVar9 + uVar26 * 2 + 2] + local_b8;
      if (0x1fffff < uVar23) goto LAB_001c3196;
      uVar16 = uVar21 + (int)(uVar23 >> 0x10);
      if (0x3f < uVar16) goto LAB_001c3177;
      local_98 = (ulong)*(ushort *)
                         ((long)CTable_OffsetBits +
                         (long)(int)CTable_OffsetBits[lVar8 + uVar29 * 2 + 1] * 2 +
                         (local_98 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
      uVar10 = (ulong)*(ushort *)
                       ((long)CTable_MatchLength +
                       (long)(int)CTable_MatchLength[lVar7 + uVar13 * 2 + 1] * 2 +
                       (uVar10 >> ((byte)(uVar17 >> 0x10) & 0x3f)) * 2 + 4);
      uVar11 = (ulong)(BIT_mask[uVar22 >> 0x10] & uVar18) << (sbyte)uVar15 | uVar11 |
               (ulong)(BIT_mask[uVar17 >> 0x10] & uVar27) << ((byte)uVar24 & 0x3f) |
               (ulong)(BIT_mask[uVar23 >> 0x10] & (uint)local_b8) << ((byte)uVar21 & 0x3f);
      bVar2 = ""[uVar26];
      bVar3 = ""[uVar13];
      local_b8 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar9 + uVar26 * 2 + 1] * 2 +
                         (local_b8 >> ((byte)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
      uVar15 = (uint)bVar1 + (uint)bVar2 + (uint)bVar3;
      if (0x1e < uVar15) {
        puVar19 = (ulong *)((ulong)(uVar16 >> 3) + (long)puVar12);
        if (puVar25 < puVar19) {
          puVar19 = puVar25;
        }
        *puVar12 = uVar11;
        uVar11 = uVar11 >> ((byte)uVar16 & 0x38);
        uVar16 = uVar16 & 7;
        puVar12 = puVar19;
      }
      uVar24 = uVar16 + bVar2;
      if ((0x3f < uVar24) || (uVar18 = uVar24 + bVar3, 0x3f < uVar18)) goto LAB_001c3177;
      uVar11 = (ulong)((uint)sequences[uVar20].mlBase & BIT_mask[(uint)bVar3]) <<
               ((byte)uVar24 & 0x3f) |
               (ulong)((uint)sequences[uVar20].litLength & BIT_mask[(uint)bVar2]) <<
               ((byte)uVar16 & 0x3f) | uVar11;
      puVar19 = puVar12;
      if (0x38 < uVar15) {
        puVar19 = (ulong *)((ulong)(uVar18 >> 3) + (long)puVar12);
        if (puVar25 < puVar19) {
          puVar19 = puVar25;
        }
        *puVar12 = uVar11;
        uVar11 = uVar11 >> ((byte)uVar18 & 0x38);
        uVar18 = uVar18 & 7;
      }
      puVar28 = puVar19;
      if (longOffsets == 0) {
        if (0x1f < bVar1) goto LAB_001c3196;
        uVar15 = uVar18 + bVar1;
        if (0x3f < uVar15) goto LAB_001c3177;
        uVar24 = sequences[uVar20].offBase;
        uVar22 = uVar29;
      }
      else {
        uVar22 = 0x38;
        if (bVar1 < 0x38) {
          uVar22 = uVar29;
        }
        uVar15 = (uint)bVar1 - (int)uVar22;
        if (0x38 < bVar1) {
          if (0x1f < uVar15) goto LAB_001c3196;
          uVar24 = uVar18 + uVar15;
          if (0x3f < uVar24) goto LAB_001c3177;
          uVar11 = (ulong)(sequences[uVar20].offBase & BIT_mask[uVar15]) << ((byte)uVar18 & 0x3f) |
                   uVar11;
          puVar28 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar19);
          if (puVar25 < puVar28) {
            puVar28 = puVar25;
          }
          *puVar19 = uVar11;
          uVar11 = uVar11 >> ((byte)uVar24 & 0x38);
          uVar18 = uVar24 & 7;
        }
        uVar24 = sequences[uVar20].offBase >> ((byte)uVar15 & 0x1f);
        if (0x1f < bVar1) goto LAB_001c3196;
        uVar15 = uVar18 + (int)uVar22;
        if (0x3f < uVar15) goto LAB_001c3177;
      }
      if (puVar25 < puVar28) goto LAB_001c31b5;
      uVar11 = (ulong)(uVar24 & BIT_mask[uVar22]) << ((byte)uVar18 & 0x3f) | uVar11;
      puVar12 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar28);
      if (puVar25 < puVar12) {
        puVar12 = puVar25;
      }
      *puVar28 = uVar11;
      uVar11 = uVar11 >> ((byte)uVar15 & 0x38);
      uVar20 = uVar20 - 1;
      uVar15 = uVar15 & 7;
    } while (uVar20 < nbSeq);
  }
  if (uVar4 < 0x20) {
    uVar24 = uVar15 + uVar4;
    if (uVar24 < 0x40) {
      uVar11 = (ulong)((uint)uVar10 & BIT_mask[uVar4]) << (sbyte)uVar15 | uVar11;
      puVar19 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar12);
      if (puVar25 < puVar19) {
        puVar19 = puVar25;
      }
      *puVar12 = uVar11;
      if (0x1f < uVar5) goto LAB_001c3196;
      uVar15 = (uVar24 & 7) + (uint)uVar5;
      if (uVar15 < 0x40) {
        uVar11 = (ulong)((uint)local_98 & BIT_mask[uVar5]) << (sbyte)(uVar24 & 7) |
                 uVar11 >> ((byte)uVar24 & 0x38);
        puVar12 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar19);
        if (puVar25 < puVar12) {
          puVar12 = puVar25;
        }
        *puVar19 = uVar11;
        if (0x1f < uVar6) goto LAB_001c3196;
        uVar24 = (uVar15 & 7) + (uint)uVar6;
        if (uVar24 < 0x40) {
          uVar11 = (ulong)((uint)local_b8 & BIT_mask[uVar6]) << (sbyte)(uVar15 & 7) |
                   uVar11 >> ((byte)uVar15 & 0x38);
          *puVar12 = uVar11;
          uVar15 = (uVar24 & 7) + 1;
          puVar12 = (ulong *)((ulong)(uVar24 >> 3) + (long)puVar12);
          if (puVar25 < puVar12) {
            puVar12 = puVar25;
          }
          puVar19 = (ulong *)((ulong)(uVar15 >> 3) + (long)puVar12);
          if (puVar25 < puVar19) {
            puVar19 = puVar25;
          }
          *puVar12 = uVar11 >> ((byte)uVar24 & 0x38) | 1L << (uVar24 & 7);
          sVar14 = 0;
          if (puVar19 < puVar25) {
            sVar14 = (long)puVar19 - ((long)dst + ((ulong)((uVar15 & 7) == 0) - 1));
          }
          if (sVar14 == 0) {
            return 0xffffffffffffffba;
          }
          return sVar14;
        }
      }
    }
LAB_001c3177:
    __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                  ,0xb9,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
  }
LAB_001c3196:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/bitstream.h"
                ,0xb8,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}